

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O0

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::FunctionReturningArray
          (DiagnosticsReporter *this,SyntaxToken *decltorTk)

{
  SyntaxToken local_198;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  DiagnosticDescriptor local_f0;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  SyntaxToken *decltorTk_local;
  DiagnosticsReporter *this_local;
  
  s.field_2._8_8_ = decltorTk;
  SyntaxToken::valueText_abi_cxx11_(&local_78,decltorTk);
  std::operator+(&local_58,"`",&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"\' declared as function returning an array");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string(local_110,(string *)&ID_of_FunctionReturningArray_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"[[function returning array]]",&local_131);
  std::__cxx11::string::string(local_158,(string *)local_38);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_f0,local_110,local_130,local_158,2);
  local_198.field_10 = decltorTk->field_10;
  local_198.tree_ = decltorTk->tree_;
  local_198.syntaxK_ = decltorTk->syntaxK_;
  local_198.byteSize_ = decltorTk->byteSize_;
  local_198.charSize_ = decltorTk->charSize_;
  local_198._14_2_ = *(undefined2 *)&decltorTk->field_0xe;
  local_198.byteOffset_ = decltorTk->byteOffset_;
  local_198.charOffset_ = decltorTk->charOffset_;
  local_198.matchingBracket_ = decltorTk->matchingBracket_;
  local_198.field_7 = decltorTk->field_7;
  local_198._34_2_ = *(undefined2 *)&decltorTk->field_0x22;
  local_198.lineno_ = decltorTk->lineno_;
  local_198.column_ = decltorTk->column_;
  local_198._44_4_ = *(undefined4 *)&decltorTk->field_0x2c;
  diagnose(this,&local_f0,&local_198);
  SyntaxToken::~SyntaxToken(&local_198);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_f0);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::FunctionReturningArray(SyntaxToken decltorTk)
{
    auto s = "`"
            + decltorTk.valueText()
            + "' declared as function returning an array";

    diagnose(DiagnosticDescriptor(
                 ID_of_FunctionReturningArray,
                 "[[function returning array]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             decltorTk);
}